

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O3

void __thiscall fat::print_file_clusters(fat *this,string *file_path)

{
  int32_t iVar1;
  ostream *this_00;
  long lVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  char local_61;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_61 = '/';
  explode(&local_48,(fat *)file_path,file_path,&local_61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,&local_48);
  iVar1 = get_file_start(this,&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PATH NOT FOUND",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else {
    this_00 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(file_path->_M_dataplus)._M_p,
                         file_path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,": ",2);
    std::ostream::operator<<(this_00,iVar1);
    lVar2 = (long)iVar1;
    if (this->fat_table[lVar2] != this->FAT_FILE_END) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        std::ostream::operator<<((ostream *)&std::cout,this->fat_table[lVar2]);
        lVar2 = (long)this->fat_table[lVar2];
      } while (this->fat_table[lVar2] != this->FAT_FILE_END);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void fat::print_file_clusters(std::string file_path) {
    std::vector<std::string> result = explode(file_path, '/');
    int32_t found_file = get_file_start(result);
    if (found_file != 0) {
        std::cout << file_path << ": " << found_file;
        int32_t curr_cluster = found_file;
        while (fat_table[curr_cluster] != FAT_FILE_END) {
            std::cout << ", " << fat_table[curr_cluster];
            curr_cluster = fat_table[curr_cluster];
        }
        std::cout << std::endl;
    } else {
        std::cout << "PATH NOT FOUND" << std::endl;
    }
}